

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::TriageCompareCosDistances<long_double>
              (Vector3<long_double> *x,Vector3<long_double> *a,Vector3<long_double> *b)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  uint uVar6;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  
  lVar9 = *(longdouble *)a->c_;
  lVar1 = *(longdouble *)x->c_;
  lVar2 = *(longdouble *)(a->c_ + 1);
  lVar3 = *(longdouble *)(x->c_ + 1);
  lVar4 = *(longdouble *)(a->c_ + 2);
  lVar5 = *(longdouble *)(x->c_ + 2);
  lVar8 = in_ST0;
  sqrtl();
  lVar7 = (lVar2 * lVar3 + (longdouble)0 + lVar1 * lVar9 + lVar4 * lVar5) / in_ST0;
  lVar9 = *(longdouble *)b->c_;
  lVar1 = *(longdouble *)x->c_;
  lVar2 = *(longdouble *)(b->c_ + 1);
  lVar3 = *(longdouble *)(x->c_ + 1);
  lVar4 = *(longdouble *)(b->c_ + 2);
  lVar5 = *(longdouble *)(x->c_ + 2);
  sqrtl();
  lVar8 = (lVar2 * lVar3 + (longdouble)0 + lVar1 * lVar9 + lVar4 * lVar5) / lVar8;
  lVar9 = (longdouble)8.131516e-20 + (longdouble)3.7947076e-19 * ABS(lVar7) +
          (longdouble)8.131516e-20 + (longdouble)3.7947076e-19 * ABS(lVar8);
  lVar7 = lVar7 - lVar8;
  uVar6 = 0xffffffff;
  if (lVar7 <= lVar9) {
    uVar6 = (uint)(lVar7 < -lVar9);
  }
  return uVar6;
}

Assistant:

int TriageCompareCosDistances(const Vector3<T>& x,
                              const Vector3<T>& a, const Vector3<T>& b) {
  T cos_ax_error, cos_bx_error;
  T cos_ax = GetCosDistance(a, x, &cos_ax_error);
  T cos_bx = GetCosDistance(b, x, &cos_bx_error);
  T diff = cos_ax - cos_bx;
  T error = cos_ax_error + cos_bx_error;
  return (diff > error) ? -1 : (diff < -error) ? 1 : 0;
}